

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_utils.cpp
# Opt level: O2

string * license::remove_extension(string *__return_storage_ptr__,string *path)

{
  bool bVar1;
  ulong uVar2;
  ulong uVar3;
  
  bVar1 = std::operator==(path,".");
  if (((!bVar1) && (bVar1 = std::operator==(path,".."), !bVar1)) &&
     (uVar2 = std::__cxx11::string::find_last_of((char *)path,0x4555db), uVar2 != 0xffffffffffffffff
     )) {
    uVar3 = std::__cxx11::string::find_last_of((char *)path,0x4384d4);
    if (uVar3 == 0xffffffffffffffff) {
      if (uVar2 != 0) goto LAB_0018bfe8;
    }
    else if (uVar3 <= uVar2) {
LAB_0018bfe8:
      std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)path);
      return __return_storage_ptr__;
    }
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)path);
  return __return_storage_ptr__;
}

Assistant:

string remove_extension(const string& path) {
	if (path == "." || path == "..") {
		return path;
	}
	size_t dotpos = path.find_last_of(".");
	//no dot
	if (dotpos == string::npos) {
		return path;
	}
	//find the last path separator
	size_t pathsep_pos = path.find_last_of("\\/");
	if (pathsep_pos == string::npos) {
		return (dotpos == 0 ? path : path.substr(0, dotpos));
	} else if(pathsep_pos >= dotpos +1) {
		return path;
	}
	return path.substr(0, dotpos);
}